

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

void clunk::ClearKingDirs<true>(int from)

{
  uint to;
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint to_00;
  
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x281,"void clunk::ClearKingDirs(const int) [color = true]");
  }
  uVar3 = (&_queenKing)[(uint)from];
  do {
    if (uVar3 == 0) {
      return;
    }
    if ((uVar3 & 0xff) == 0) {
      __assert_fail("mvs & 0xFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x283,"void clunk::ClearKingDirs(const int) [color = true]");
    }
    to_00 = (int)(uVar3 & 0xff) - 1;
    iVar1 = Direction(from,to_00);
    if ((0x22 < iVar1 + 0x11U) || ((0x700050007U >> ((ulong)(iVar1 + 0x11U) & 0x3f) & 1) == 0)) {
      __assert_fail("IS_DIR(dir)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x286,"void clunk::ClearKingDirs(const int) [color = true]");
    }
    uVar4 = from;
    do {
      to = iVar1 + uVar4;
      if ((to & 0xffffff88) != 0) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x288,"void clunk::ClearKingDirs(const int) [color = true]");
      }
      iVar2 = Direction(from,to);
      if (iVar2 != iVar1) {
        __assert_fail("Direction(from, to) == dir",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x289,"void clunk::ClearKingDirs(const int) [color = true]");
      }
      uVar4 = uVar4 + iVar1 + 8;
    } while ((_kingDir[uVar4] != '\0') && (_kingDir[uVar4] = 0, uVar4 = to, to_00 != to));
    uVar3 = uVar3 >> 8;
  } while( true );
}

Assistant:

void ClearKingDirs(const int from) {
  assert(IS_SQUARE(from));
  for (uint64_t mvs = _queenKing[from]; mvs; mvs >>= 8) {
    assert(mvs & 0xFF);
    const int end = ((mvs & 0xFF) - 1);
    const int dir = Direction(from, end);
    assert(IS_DIR(dir));
    for (int to = (from + dir);; to += dir) {
      assert(IS_SQUARE(to));
      assert(Direction(from, to) == dir);
      if (_kingDir[to + (color * 8)]) {
        _kingDir[to + (color * 8)] = 0;
      }
      else {
        break;
      }
      if (to == end) {
        break;
      }
    }
  }
}